

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::BlendView(DBaseStatusBar *this,float *blend)

{
  float fVar1;
  bool bVar2;
  AActor *pAVar3;
  float fVar4;
  player_t *local_40;
  player_t *player;
  float cnt;
  float *blend_local;
  DBaseStatusBar *this_local;
  
  fVar1 = BaseBlendA;
  fVar4 = FFloatCVar::operator_cast_to_float(&underwater_fade_scalar);
  V_AddBlend((float)BaseBlendR / 255.0,(float)BaseBlendG / 255.0,(float)BaseBlendB / 255.0,
             fVar1 * fVar4,blend);
  V_AddPlayerBlend(this->CPlayer,blend,1.0,0xe4);
  if (((screen->Accel2D & 1U) != 0) ||
     (((bVar2 = TObjPtr<AActor>::operator!=(&this->CPlayer->camera,(AActor *)0x0), bVar2 &&
       (menuactive == MENU_Off)) && (ConsoleState == c_up)))) {
    bVar2 = TObjPtr<AActor>::operator!=(&this->CPlayer->camera,(AActor *)0x0);
    if ((bVar2) &&
       (pAVar3 = TObjPtr<AActor>::operator->(&this->CPlayer->camera),
       pAVar3->player != (player_t *)0x0)) {
      pAVar3 = TObjPtr<AActor>::operator->(&this->CPlayer->camera);
      local_40 = pAVar3->player;
    }
    else {
      local_40 = this->CPlayer;
    }
    V_AddBlend(local_40->BlendR,local_40->BlendG,local_40->BlendB,local_40->BlendA,blend);
  }
  V_SetBlend((int)(*blend * 255.0),(int)(blend[1] * 255.0),(int)(blend[2] * 255.0),
             (int)(blend[3] * 256.0));
  return;
}

Assistant:

void DBaseStatusBar::BlendView (float blend[4])
{
	// [Nash] Allow user to set blend intensity
	float cnt = (BaseBlendA * underwater_fade_scalar);

	V_AddBlend (BaseBlendR / 255.f, BaseBlendG / 255.f, BaseBlendB / 255.f, cnt, blend);
	V_AddPlayerBlend(CPlayer, blend, 1.0f, 228);

	if (screen->Accel2D || (CPlayer->camera != NULL && menuactive == MENU_Off && ConsoleState == c_up))
	{
		player_t *player = (CPlayer->camera != NULL && CPlayer->camera->player != NULL) ? CPlayer->camera->player : CPlayer;
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	V_SetBlend ((int)(blend[0] * 255.0f), (int)(blend[1] * 255.0f),
				(int)(blend[2] * 255.0f), (int)(blend[3] * 256.0f));
}